

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_sse2_128_64.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_diag_sse2_128_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  parasail_result_t *ppVar5;
  int64_t *ptr;
  int64_t *ptr_00;
  ulong *ptr_01;
  long lVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  char *pcVar10;
  ulong extraout_RDX;
  int64_t iVar11;
  ulong uVar12;
  bool bVar13;
  ulong uVar14;
  ulong uVar15;
  char *__format;
  int iVar17;
  ulong uVar18;
  ulong extraout_XMM0_Qa;
  undefined1 auVar19 [16];
  ulong extraout_XMM0_Qa_00;
  ulong extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  int64_t iVar23;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  ulong extraout_XMM0_Qa_01;
  ulong extraout_XMM0_Qa_02;
  ulong extraout_XMM0_Qa_03;
  ulong extraout_XMM0_Qa_04;
  ulong extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qa_06;
  undefined1 extraout_XMM0 [16];
  ulong extraout_XMM0_Qb_01;
  ulong extraout_XMM0_Qb_02;
  ulong extraout_XMM0_Qb_03;
  ulong extraout_XMM0_Qb_04;
  ulong extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  undefined1 extraout_XMM0_00 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  ulong uVar26;
  __m128i_64_t A_1;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  __m128i_64_t A;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int iVar38;
  int iVar39;
  int iVar40;
  __m128i_64_t B_2;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  __m128i_64_t B_1;
  undefined1 auVar43 [16];
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i a_07;
  __m128i a_08;
  __m128i alVar44;
  __m128i alVar45;
  __m128i alVar46;
  ulong local_2b8;
  ulong uStack_2b0;
  int64_t *local_2a8;
  ulong uStack_290;
  ulong local_268;
  ulong uStack_260;
  ulong uStack_250;
  undefined1 local_248 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  ulong local_1f8;
  ulong uStack_1f0;
  ulong local_1c8;
  ulong uStack_1c0;
  ulong local_1b8;
  ulong uStack_1b0;
  ulong local_1a8;
  ulong uStack_1a0;
  ulong local_198 [4];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  ulong local_158 [11];
  long lStack_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  ulong local_a8;
  ulong uStack_a0;
  ulong local_98;
  ulong uStack_90;
  ulong local_88;
  ulong uStack_80;
  ulong local_78;
  ulong uStack_70;
  ulong local_68;
  ulong uStack_60;
  ulong local_58;
  ulong uStack_50;
  ulong local_48;
  long lStack_40;
  parasail_matrix_t *ppVar16;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar10 = "_s2";
LAB_0050c206:
    fprintf(_stderr,__format,"parasail_sg_flags_diag_sse2_128_64",pcVar10);
    return (parasail_result_t *)0x0;
  }
  uVar12 = CONCAT44(0,s2Len);
  if (s2Len < 1) {
    __format = "%s: %s must be > 0\n";
    pcVar10 = "s2Len";
    goto LAB_0050c206;
  }
  if (open < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar10 = "open";
    goto LAB_0050c206;
  }
  if (gap < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar10 = "gap";
    goto LAB_0050c206;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar10 = "matrix";
    goto LAB_0050c206;
  }
  if (matrix->type == 0) {
    if (_s1 == (char *)0x0) {
      __format = "%s: missing %s\n";
      pcVar10 = "_s1";
      goto LAB_0050c206;
    }
    alVar45[0] = (ulong)(uint)_s1Len;
    if (_s1Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar10 = "_s1Len";
      goto LAB_0050c206;
    }
  }
  else {
    alVar45[0] = (ulong)(uint)matrix->length;
  }
  iVar2 = (int)alVar45[0];
  iVar4 = matrix->min;
  iVar17 = -open;
  uVar14 = 0x8000000000000000 - (long)iVar4;
  if (iVar4 != iVar17 && SBORROW4(iVar4,iVar17) == iVar4 + open < 0) {
    uVar14 = CONCAT44(0,open) | 0x8000000000000000;
  }
  uVar14 = uVar14 + 1;
  alVar45[1] = 0x7ffffffffffffffe - (long)matrix->max;
  auVar19._8_4_ = (int)uVar14;
  auVar19._0_8_ = uVar14;
  auVar19._12_4_ = (int)(uVar14 >> 0x20);
  local_168 = (undefined1  [16])0x0;
  local_228 = (undefined1  [16])0x0;
  if (s1_beg == 0) {
    local_168._4_4_ = 0;
    local_168._0_4_ = gap * 2;
    local_168._8_4_ = gap * 2;
    local_168._12_4_ = 0;
  }
  uStack_250 = auVar19._8_8_;
  local_158[7] = uStack_250;
  local_158[5] = uStack_250;
  local_158[3] = uStack_250;
  local_198[1] = uStack_250;
  local_158[1] = uStack_250;
  if (s1_beg == 0) {
    local_228._8_8_ = (long)iVar17;
    local_228._0_8_ = (long)(iVar17 - gap);
  }
  local_198[0] = uVar14;
  local_158[0] = uVar14;
  local_158[2] = uVar14;
  local_158[4] = uVar14;
  local_158[6] = uVar14;
  ppVar5 = parasail_result_new();
  if (ppVar5 == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  ppVar5->flag = (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar5->flag | 0x2801002;
  uVar15 = (ulong)(s2Len + 2);
  ptr = parasail_memalign_int64_t(0x10,uVar15);
  ptr_00 = parasail_memalign_int64_t(0x10,uVar15);
  ptr_01 = (ulong *)parasail_memalign_int64_t(0x10,uVar15);
  if (ptr_01 == (ulong *)0x0 || (ptr_00 == (int64_t *)0x0 || ptr == (int64_t *)0x0)) {
    return (parasail_result_t *)0x0;
  }
  lVar6 = (long)iVar2;
  if (matrix->type == 0) {
    uVar15 = (ulong)(iVar2 + 1);
    local_2a8 = parasail_memalign_int64_t(0x10,uVar15);
    uVar9 = 0;
    if (local_2a8 == (int64_t *)0x0) {
      return (parasail_result_t *)0x0;
    }
    a_07[0] = 0;
    if (0 < iVar2) {
      a_07[0] = alVar45[0];
    }
    for (; lVar7 = lVar6, a_07[0] != uVar9; uVar9 = uVar9 + 1) {
      uVar15 = (ulong)(byte)_s1[uVar9];
      alVar45[0] = (ulong)matrix->mapper[uVar15];
      local_2a8[uVar9] = alVar45[0];
    }
    for (; lVar7 <= lVar6; lVar7 = lVar7 + 1) {
      local_2a8[lVar7] = 0;
    }
  }
  else {
    local_2a8 = (int64_t *)0x0;
    alVar45[0] = extraout_RDX;
  }
  local_f8._8_4_ = iVar2;
  local_f8._0_8_ = lVar6;
  local_f8._12_4_ = iVar2 >> 0x1f;
  auVar20._8_4_ = 0xffffffff;
  auVar20._0_8_ = 0xffffffffffffffff;
  auVar20._12_4_ = 0xffffffff;
  local_c8._8_4_ = s2Len;
  local_c8._0_8_ = uVar12;
  local_c8._12_4_ = 0;
  local_178._8_4_ = (int)alVar45[1];
  local_178._0_8_ = alVar45[1];
  local_178._12_4_ = (int)((ulong)alVar45[1] >> 0x20);
  local_d8._8_4_ = open;
  local_d8._0_8_ = CONCAT44(0,open);
  local_d8._12_4_ = 0;
  local_e8._4_4_ = 0;
  local_e8._0_4_ = gap;
  local_e8._8_4_ = gap;
  local_e8._12_4_ = 0;
  local_158[10] = lVar6 + -1;
  lStack_100 = local_f8._8_8_ + auVar20._8_8_;
  local_b8._0_8_ = uVar12 - 1;
  local_b8._8_8_ = auVar20._8_8_ + uVar12;
  piVar1 = matrix->mapper;
  for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
    alVar45[0] = (ulong)piVar1[(byte)_s2[uVar9]];
    ptr[uVar9 + 1] = alVar45[0];
  }
  *ptr = 0;
  for (uVar9 = uVar12; (int)uVar9 <= s2Len; uVar9 = uVar9 + 1) {
    ptr[uVar9 + 1] = 0;
  }
  uVar9 = 0;
  alVar45[1] = (long)iVar17;
  if (s2_beg == 0) {
    for (; uVar12 != uVar9; uVar9 = uVar9 + 1) {
      ptr_00[uVar9 + 1] = alVar45[1];
      ptr_01[uVar9 + 1] = uVar14;
      alVar45[1] = alVar45[1] - (ulong)(uint)gap;
    }
  }
  else {
    for (; uVar12 != uVar9; uVar9 = uVar9 + 1) {
      ptr_00[uVar9 + 1] = 0;
      ptr_01[uVar9 + 1] = uVar14;
    }
  }
  *ptr_01 = uVar14;
  for (uVar9 = uVar12; (int)uVar9 <= s2Len; uVar9 = uVar9 + 1) {
    ptr_00[uVar9 + 1] = uVar14;
    ptr_01[uVar9 + 1] = uVar14;
  }
  *ptr_00 = 0;
  local_158[8] = uStack_250;
  local_158[9] = 0;
  local_248 = ZEXT416(1);
  uStack_1a0 = uStack_250;
  uStack_1b0 = uStack_250;
  uStack_1c0 = uStack_250;
  uStack_260 = uStack_250;
  uStack_1f0 = uStack_250;
  uVar9 = 0;
  local_268 = uVar14;
  local_1f8 = uVar14;
  local_1c8 = uVar14;
  local_1b8 = uVar14;
  local_1a8 = uVar14;
  while ((long)uVar9 < lVar6) {
    if (matrix->type == 0) {
      a_07[0] = local_2a8[uVar9];
      iVar11 = local_2a8[uVar9 + 1];
    }
    else {
      uVar3 = (uint)uVar9 | 1;
      if (lVar6 <= (long)(uVar9 | 1)) {
        uVar3 = iVar2 - 1U;
      }
      iVar11 = (int64_t)(int)uVar3;
      a_07[0] = uVar9;
    }
    piVar1 = matrix->matrix;
    iVar4 = matrix->size;
    alVar44[1] = uVar9;
    alVar44[0] = alVar45[0];
    a[1] = uVar15;
    a[0] = (longlong)matrix;
    alVar45[0] = uVar9;
    ppVar16 = matrix;
    alVar44 = _mm_cmplt_epi64_rpl(a,alVar44);
    b[0] = alVar44[1];
    b[1] = alVar45[0];
    a_00[1] = uVar15;
    a_00[0] = (longlong)ppVar16;
    local_98 = extraout_XMM0_Qa;
    uStack_90 = extraout_XMM0_Qb;
    alVar45 = _mm_cmpeq_epi64_rpl(a_00,b);
    local_a8 = extraout_XMM0_Qa_00;
    uStack_a0 = extraout_XMM0_Qb_00;
    iVar8 = iVar17 - (uint)uVar9 * gap;
    iVar23 = *ptr_00;
    if (s1_beg != 0) {
      iVar8 = 0;
    }
    uStack_290 = (ulong)iVar8;
    alVar46[1] = alVar45[1];
    alVar46[0] = uStack_290;
    local_198[3] = uVar9 + 2;
    *ptr_00 = (long)iVar17 - (uVar9 + 2) * (ulong)(uint)gap;
    uVar18 = 0;
    local_2b8 = 0xffffffffffffffff;
    uStack_2b0 = 0;
    uVar9 = local_158[8];
    uVar26 = local_158[8];
    local_218 = auVar19;
    local_208 = auVar19;
    while( true ) {
      alVar45[0] = alVar46[1];
      if (uVar12 < uVar18) break;
      lStack_40 = ptr_00[uVar18 + 1];
      auVar31._0_8_ = uStack_290 - local_d8._0_8_;
      auVar31._8_8_ = lStack_40 - local_d8._8_8_;
      auVar34._0_8_ = CONCAT44(local_218._4_4_,local_218._8_4_) - local_e8._0_8_;
      auVar34._8_8_ = ptr_01[uVar18 + 1] - local_e8._8_8_;
      auVar42._0_8_ = uVar9 - local_d8._0_8_;
      auVar42._8_8_ = uStack_290 - local_d8._8_8_;
      auVar43._0_8_ = local_208._0_8_ - local_e8._0_8_;
      auVar43._8_8_ = local_208._8_8_ - local_e8._8_8_;
      alVar45[1] = (long)piVar1[a_07[0] * (long)iVar4 + ptr[uVar18 + 1]];
      auVar24._0_8_ = (long)piVar1[iVar11 * iVar4 + ptr[uVar18]] + uVar26;
      auVar24._8_8_ = alVar45[1] + iVar23;
      auVar20 = auVar34 ^ _DAT_008a1890;
      auVar32 = auVar31 ^ _DAT_008a1890;
      iVar8 = -(uint)(auVar20._0_4_ < auVar32._0_4_);
      iVar38 = -(uint)(auVar20._4_4_ < auVar32._4_4_);
      iVar39 = -(uint)(auVar20._8_4_ < auVar32._8_4_);
      iVar40 = -(uint)(auVar20._12_4_ < auVar32._12_4_);
      auVar41._4_4_ = iVar8;
      auVar41._0_4_ = iVar8;
      auVar41._8_4_ = iVar39;
      auVar41._12_4_ = iVar39;
      iVar8 = -(uint)(auVar32._4_4_ == auVar20._4_4_);
      iVar39 = -(uint)(auVar32._12_4_ == auVar20._12_4_);
      auVar32._4_4_ = iVar8;
      auVar32._0_4_ = iVar8;
      auVar32._8_4_ = iVar39;
      auVar32._12_4_ = iVar39;
      auVar33._4_4_ = iVar38;
      auVar33._0_4_ = iVar38;
      auVar33._8_4_ = iVar40;
      auVar33._12_4_ = iVar40;
      auVar33 = auVar33 | auVar32 & auVar41;
      auVar34 = ~auVar33 & auVar34 | auVar31 & auVar33;
      auVar20 = auVar43 ^ _DAT_008a1890;
      auVar32 = auVar42 ^ _DAT_008a1890;
      iVar8 = -(uint)(auVar20._0_4_ < auVar32._0_4_);
      iVar38 = -(uint)(auVar20._4_4_ < auVar32._4_4_);
      iVar39 = -(uint)(auVar20._8_4_ < auVar32._8_4_);
      iVar40 = -(uint)(auVar20._12_4_ < auVar32._12_4_);
      auVar35._4_4_ = iVar8;
      auVar35._0_4_ = iVar8;
      auVar35._8_4_ = iVar39;
      auVar35._12_4_ = iVar39;
      iVar8 = -(uint)(auVar32._4_4_ == auVar20._4_4_);
      iVar39 = -(uint)(auVar32._12_4_ == auVar20._12_4_);
      auVar28._4_4_ = iVar8;
      auVar28._0_4_ = iVar8;
      auVar28._8_4_ = iVar39;
      auVar28._12_4_ = iVar39;
      auVar27._4_4_ = iVar38;
      auVar27._0_4_ = iVar38;
      auVar27._8_4_ = iVar40;
      auVar27._12_4_ = iVar40;
      auVar27 = auVar27 | auVar28 & auVar35;
      auVar28 = ~auVar27 & auVar43 | auVar42 & auVar27;
      auVar20 = auVar28 ^ _DAT_008a1890;
      auVar32 = auVar24 ^ _DAT_008a1890;
      iVar8 = -(uint)(auVar20._0_4_ < auVar32._0_4_);
      iVar38 = -(uint)(auVar20._4_4_ < auVar32._4_4_);
      iVar39 = -(uint)(auVar20._8_4_ < auVar32._8_4_);
      iVar40 = -(uint)(auVar20._12_4_ < auVar32._12_4_);
      auVar36._4_4_ = iVar8;
      auVar36._0_4_ = iVar8;
      auVar36._8_4_ = iVar39;
      auVar36._12_4_ = iVar39;
      iVar8 = -(uint)(auVar32._4_4_ == auVar20._4_4_);
      iVar39 = -(uint)(auVar32._12_4_ == auVar20._12_4_);
      auVar30._4_4_ = iVar8;
      auVar30._0_4_ = iVar8;
      auVar30._8_4_ = iVar39;
      auVar30._12_4_ = iVar39;
      auVar29._4_4_ = iVar38;
      auVar29._0_4_ = iVar38;
      auVar29._8_4_ = iVar40;
      auVar29._12_4_ = iVar40;
      auVar29 = auVar29 | auVar30 & auVar36;
      auVar30 = ~auVar29 & auVar28 | auVar24 & auVar29;
      auVar20 = auVar30 ^ _DAT_008a1890;
      auVar32 = auVar34 ^ _DAT_008a1890;
      iVar8 = -(uint)(auVar32._0_4_ < auVar20._0_4_);
      iVar38 = -(uint)(auVar32._4_4_ < auVar20._4_4_);
      iVar39 = -(uint)(auVar32._8_4_ < auVar20._8_4_);
      iVar40 = -(uint)(auVar32._12_4_ < auVar20._12_4_);
      auVar37._4_4_ = iVar8;
      auVar37._0_4_ = iVar8;
      auVar37._8_4_ = iVar39;
      auVar37._12_4_ = iVar39;
      iVar8 = -(uint)(auVar32._4_4_ == auVar20._4_4_);
      iVar39 = -(uint)(auVar32._12_4_ == auVar20._12_4_);
      auVar21._4_4_ = iVar8;
      auVar21._0_4_ = iVar8;
      auVar21._8_4_ = iVar39;
      auVar21._12_4_ = iVar39;
      auVar25._4_4_ = iVar38;
      auVar25._0_4_ = iVar38;
      auVar25._8_4_ = iVar40;
      auVar25._12_4_ = iVar40;
      auVar25 = auVar25 | auVar21 & auVar37;
      a_01[1] = uVar15;
      a_01[0] = (longlong)ppVar16;
      local_48 = uStack_290;
      alVar44 = _mm_cmpeq_epi64_rpl(a_01,alVar45);
      b_00[0] = alVar44[1];
      auVar20 = extraout_XMM0 & local_228 |
                ~extraout_XMM0 & (~auVar25 & auVar34 | auVar30 & auVar25);
      local_218 = ~extraout_XMM0 & auVar34 | extraout_XMM0 & auVar19;
      uVar9 = auVar20._0_8_;
      local_208 = ~extraout_XMM0 & auVar28 | extraout_XMM0 & auVar19;
      ptr_00[uVar18] = uVar9;
      ptr_01[uVar18] = local_218._0_8_;
      b_00[1] = alVar45[1];
      a_02[1] = uVar15;
      a_02[0] = (longlong)ppVar16;
      alVar44 = _mm_cmpeq_epi64_rpl(a_02,b_00);
      b_01[0] = alVar44[1];
      b_01[1] = alVar45[1];
      a_03[1] = uVar15;
      a_03[0] = (longlong)ppVar16;
      local_58 = extraout_XMM0_Qa_01;
      uStack_50 = extraout_XMM0_Qb_01;
      alVar44 = _mm_cmpgt_epi64_rpl(a_03,b_01);
      b_02[0] = alVar44[1];
      b_02[1] = alVar45[1];
      a_04[1] = uVar15;
      a_04[0] = (longlong)ppVar16;
      local_68 = extraout_XMM0_Qa_02;
      uStack_60 = extraout_XMM0_Qb_02;
      alVar44 = _mm_cmplt_epi64_rpl(a_04,b_02);
      b_03[0] = alVar44[1];
      b_03[1] = alVar45[1];
      a_05[1] = uVar15;
      a_05[0] = (longlong)ppVar16;
      local_78 = extraout_XMM0_Qa_03;
      uStack_70 = extraout_XMM0_Qb_03;
      alVar44 = _mm_cmpgt_epi64_rpl(a_05,b_03);
      b_04[0] = alVar44[1];
      b_04[1] = alVar45[1];
      a_06[1] = uVar15;
      a_06[0] = (longlong)ppVar16;
      local_88 = extraout_XMM0_Qa_04;
      uStack_80 = extraout_XMM0_Qb_04;
      alVar46 = _mm_cmpgt_epi64_rpl(a_06,b_04);
      local_88 = local_78 & local_68 & local_a8 & local_88;
      uStack_80 = uStack_70 & uStack_60 & uStack_a0 & uStack_80;
      alVar45[0] = local_98 & local_58 & extraout_XMM0_Qa_05;
      uVar26 = uStack_90 & uStack_50 & extraout_XMM0_Qb_05;
      uStack_290 = auVar20._8_8_;
      local_1f8 = local_88 & uVar9 | ~local_88 & local_1f8;
      uStack_1f0 = uStack_80 & uStack_290 | ~uStack_80 & uStack_1f0;
      local_268 = alVar45[0] & uVar9 | ~alVar45[0] & local_268;
      uStack_260 = uVar26 & uStack_290 | ~uVar26 & uStack_260;
      local_1c8 = local_58 & local_a8 & uVar9 | ~(local_58 & local_a8) & local_1c8;
      uStack_1c0 = uStack_50 & uStack_a0 & uStack_290 | ~(uStack_50 & uStack_a0) & uStack_1c0;
      local_1b8 = alVar45[0] & local_248._0_8_ | ~alVar45[0] & local_1b8;
      uStack_1b0 = uVar26 & local_248._8_8_ | ~uVar26 & uStack_1b0;
      local_1a8 = local_88 & local_2b8 | ~local_88 & local_1a8;
      uStack_1a0 = uStack_80 & uStack_2b0 | ~uStack_80 & uStack_1a0;
      local_2b8 = local_2b8 + 1;
      uStack_2b0 = uStack_2b0 + 1;
      uVar18 = uVar18 + 1;
      uVar26 = local_48;
      iVar23 = lStack_40;
    }
    local_248._8_8_ = local_248._8_8_ + 2;
    local_248._0_8_ = local_248._0_8_ + 2;
    local_228._8_8_ = local_228._8_8_ - local_168._8_8_;
    local_228._0_8_ = local_228._0_8_ - local_168._0_8_;
    uVar9 = local_198[3];
  }
  local_158[6] = local_1f8;
  local_158[7] = uStack_1f0;
  local_158[4] = local_268;
  local_158[5] = uStack_260;
  local_158[2] = local_1c8;
  local_158[3] = uStack_1c0;
  local_198[0] = local_1b8;
  local_198[1] = uStack_1b0;
  local_158[0] = local_1a8;
  local_158[1] = uStack_1a0;
  alVar45[1] = 0;
  iVar4 = 0;
  uVar9 = 0;
  uVar12 = uVar14;
  alVar45[0] = uVar14;
  while( true ) {
    uVar3 = (uint)uVar9;
    a_07[0] = (ulong)(uint)s1_end;
    if ((int)alVar45[1] == 2) break;
    uVar15 = local_158[alVar45[1] + 4];
    if ((long)uVar12 < (long)uVar15) {
      a_07[0] = local_198[alVar45[1]];
LAB_0050bfc0:
      uVar9 = a_07[0] & 0xffffffff;
      uVar12 = uVar15;
    }
    else if ((uVar15 == uVar12) &&
            (a_07[0] = local_198[alVar45[1]], (long)a_07[0] < (long)(int)uVar3)) goto LAB_0050bfc0;
    if ((long)alVar45[0] < (long)local_158[alVar45[1] + 6]) {
      iVar4 = (int)local_158[alVar45[1]];
      alVar45[0] = local_158[alVar45[1] + 6];
    }
    uVar15 = local_158[alVar45[1] + 2];
    if ((long)uVar14 < (long)uVar15) {
      uVar14 = uVar15;
    }
    alVar45[1] = alVar45[1] + 1;
  }
  b_05[0]._1_7_ = (undefined7)((ulong)alVar45[1] >> 8);
  b_05[0]._0_1_ = s2_end == 0;
  bVar13 = s1_end == 0 || s2_end == 0;
  a_07[1] = CONCAT71((int7)(uVar15 >> 8),bVar13);
  uVar15 = alVar45[0];
  iVar17 = iVar4;
  if (bVar13) {
    iVar8 = s2Len + -1;
    if (s1_end != 0) goto LAB_0050c115;
    uVar15 = uVar14;
    iVar17 = iVar8;
    if (s2_end != 0) {
      uVar14 = alVar45[0];
      uVar15 = alVar45[0];
      iVar17 = iVar4;
    }
  }
  else {
    if ((long)alVar45[0] < (long)uVar12) {
      iVar8 = s2Len + -1;
      goto LAB_0050c115;
    }
    if ((uVar12 == alVar45[0]) && (iVar8 = s2Len + -1, iVar4 == iVar8)) goto LAB_0050c115;
  }
  iVar8 = iVar17;
  uVar12 = uVar15;
  uVar3 = iVar2 - 1U;
LAB_0050c115:
  iVar4 = (int)uVar12;
  b_05[1] = uVar14;
  alVar45 = _mm_cmplt_epi64_rpl(a_07,b_05);
  b_06[0] = alVar45[1];
  b_06[1] = uVar14;
  a_08[1] = a_07[1];
  a_08[0] = a_07[0];
  _mm_cmpgt_epi64_rpl(a_08,b_06);
  auVar22._8_8_ = extraout_XMM0_Qb_06;
  auVar22._0_8_ = extraout_XMM0_Qa_06;
  auVar22 = extraout_XMM0_00 | auVar22;
  if ((((((((((((((((auVar22 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar22 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar22 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar22 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar22 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar22 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar22 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar22 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar22 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar22 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar22 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar22 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar22 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar22 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar22 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar22[0xf] < '\0') {
    *(byte *)&ppVar5->flag = (byte)ppVar5->flag | 0x40;
    iVar4 = 0;
    iVar8 = 0;
    uVar3 = 0;
  }
  ppVar5->score = iVar4;
  ppVar5->end_query = uVar3;
  ppVar5->end_ref = iVar8;
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  if (matrix->type == 0) {
    parasail_free(local_2a8);
    return ppVar5;
  }
  return ppVar5;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxHRow;
    __m128i vMaxHCol;
    __m128i vLastVal;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 2; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vOpen = _mm_set1_epi64x_rpl(open);
    vGap  = _mm_set1_epi64x_rpl(gap);
    vOne = _mm_set1_epi64x_rpl(1);
    vN = _mm_set1_epi64x_rpl(N);
    vGapN = s1_beg ? _mm_set1_epi64x_rpl(0) : _mm_set1_epi64x_rpl(gap*N);
    vNegOne = _mm_set1_epi64x_rpl(-1);
    vI = _mm_set_epi64x_rpl(0,1);
    vJreset = _mm_set_epi64x_rpl(0,-1);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi64x_rpl(s1Len);
    vILimit1 = _mm_sub_epi64(vILimit, vOne);
    vJLimit = _mm_set1_epi64x_rpl(s2Len);
    vJLimit1 = _mm_sub_epi64(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm_set1_epi64x_rpl(0) : _mm_set_epi64x_rpl(
            -open-0*gap,
            -open-1*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int64_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int64_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        __m128i vIltLimit = _mm_cmplt_epi64_rpl(vI, vILimit);
        __m128i vIeqLimit1 = _mm_cmpeq_epi64_rpl(vI, vILimit1);
        vNH = _mm_srli_si128(vNH, 8);
        vNH = _mm_insert_epi64_rpl(vNH, H_pr[-1], 1);
        vWH = _mm_srli_si128(vWH, 8);
        vWH = _mm_insert_epi64_rpl(vWH, s1_beg ? 0 : (-open - i*gap), 1);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 8);
            vNH = _mm_insert_epi64_rpl(vNH, H_pr[j], 1);
            vF = _mm_srli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, F_pr[j], 1);
            vF = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vNH, vOpen),
                    _mm_sub_epi64(vF, vGap));
            vE = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vWH, vOpen),
                    _mm_sub_epi64(vE, vGap));
            vMat = _mm_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]]
                    );
            vNWH = _mm_add_epi64(vNWH, vMat);
            vWH = _mm_max_epi64_rpl(vNWH, vE);
            vWH = _mm_max_epi64_rpl(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi64_rpl(vJ,vNegOne);
                vWH = _mm_blendv_epi8_rpl(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWH,0);
            F_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m128i vJeqLimit1 = _mm_cmpeq_epi64_rpl(vJ, vJLimit1);
                __m128i vJgtNegOne = _mm_cmpgt_epi64_rpl(vJ, vNegOne);
                __m128i vJltLimit = _mm_cmplt_epi64_rpl(vJ, vJLimit);
                __m128i cond_j = _mm_and_si128(vIltLimit, vJeqLimit1);
                __m128i cond_i = _mm_and_si128(vIeqLimit1,
                        _mm_and_si128(vJgtNegOne, vJltLimit));
                __m128i cond_max_row = _mm_cmpgt_epi64_rpl(vWH, vMaxHRow);
                __m128i cond_max_col = _mm_cmpgt_epi64_rpl(vWH, vMaxHCol);
                __m128i cond_last_val = _mm_and_si128(vIeqLimit1, vJeqLimit1);
                __m128i cond_all_row = _mm_and_si128(cond_max_row, cond_i);
                __m128i cond_all_col = _mm_and_si128(cond_max_col, cond_j);
                vMaxHRow = _mm_blendv_epi8_rpl(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm_blendv_epi8_rpl(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm_blendv_epi8_rpl(vLastVal, vWH, cond_last_val);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all_col);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm_add_epi64(vJ, vOne);
        }
        vI = _mm_add_epi64(vI, vN);
        vIBoundary = _mm_sub_epi64(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int64_t max_row = NEG_LIMIT;
        int64_t max_col = NEG_LIMIT;
        int64_t last_val = NEG_LIMIT;
        int64_t *s = (int64_t*)&vMaxHRow;
        int64_t *t = (int64_t*)&vMaxHCol;
        int64_t *u = (int64_t*)&vLastVal;
        int64_t *i = (int64_t*)&vEndI;
        int64_t *j = (int64_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}